

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void NGA_Access_ghosts64(int g_a,int64_t *dims,void *ptr,int64_t *ld)

{
  long in_RCX;
  long in_RSI;
  int in_EDI;
  int i_1;
  int i;
  Integer _ga_work [7];
  Integer _ga_lo [7];
  Integer ndim;
  Integer a;
  Integer in_stack_00000140;
  Integer *in_stack_00000178;
  void *in_stack_00000180;
  Integer *in_stack_00000188;
  Integer in_stack_00000190;
  int local_b0;
  int local_ac;
  undefined8 local_a8 [8];
  undefined8 local_68 [7];
  long local_30;
  long local_28;
  long local_20;
  long local_10;
  
  local_28 = (long)in_EDI;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_30 = pnga_ndim(in_stack_00000140);
  pnga_access_ghost_ptr(in_stack_00000190,in_stack_00000188,in_stack_00000180,in_stack_00000178);
  for (local_ac = 0; (long)local_ac < local_30 + -1; local_ac = local_ac + 1) {
    *(undefined8 *)(local_20 + ((local_30 - local_ac) + -2) * 8) = local_a8[local_ac];
  }
  for (local_b0 = 0; local_b0 < local_30; local_b0 = local_b0 + 1) {
    *(undefined8 *)(local_10 + ((local_30 - local_b0) + -1) * 8) = local_68[local_b0];
  }
  return;
}

Assistant:

void NGA_Access_ghosts64(int g_a, int64_t dims[], void *ptr, int64_t ld[])
{
     Integer a=(Integer)g_a;
     Integer ndim = wnga_ndim(a);
     Integer _ga_lo[MAXDIM];
     Integer _ga_work[MAXDIM];

     wnga_access_ghost_ptr(a, _ga_lo, ptr, _ga_work);
     COPYF2C_64(_ga_work,ld, ndim-1);
     COPYF2C_64(_ga_lo, dims, ndim);
}